

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_test.cc
# Opt level: O2

void __thiscall xLearn::MAEMetricTest_mae_test_Test::TestBody(MAEMetricTest_mae_test_Test *this)

{
  uint uVar1;
  ThreadPool *this_00;
  char *pcVar2;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar3 [16];
  undefined1 extraout_var [56];
  undefined1 in_XMM2 [16];
  AssertHelper local_a0;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  MAEMetric metric;
  vector<float,_std::allocator<float>_> pred;
  vector<float,_std::allocator<float>_> Y;
  undefined1 auVar4 [64];
  
  Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  metric.super_Metric._vptr_Metric =
       (_func_int **)CONCAT44(metric.super_Metric._vptr_Metric._4_4_,0x41400000);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&Y,(float *)&metric);
  metric.super_Metric._vptr_Metric =
       (_func_int **)CONCAT44(metric.super_Metric._vptr_Metric._4_4_,0x41500000);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&Y,(float *)&metric);
  metric.super_Metric._vptr_Metric =
       (_func_int **)CONCAT44(metric.super_Metric._vptr_Metric._4_4_,0x41600000);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&Y,(float *)&metric);
  metric.super_Metric._vptr_Metric =
       (_func_int **)CONCAT44(metric.super_Metric._vptr_Metric._4_4_,0x41700000);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&Y,(float *)&metric);
  pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  metric.super_Metric._vptr_Metric =
       (_func_int **)CONCAT44(metric.super_Metric._vptr_Metric._4_4_,0x41300000);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&pred,(float *)&metric);
  metric.super_Metric._vptr_Metric =
       (_func_int **)CONCAT44(metric.super_Metric._vptr_Metric._4_4_,0x41400000);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&pred,(float *)&metric);
  metric.super_Metric._vptr_Metric =
       (_func_int **)CONCAT44(metric.super_Metric._vptr_Metric._4_4_,0x41500000);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&pred,(float *)&metric);
  metric.super_Metric._vptr_Metric =
       (_func_int **)CONCAT44(metric.super_Metric._vptr_Metric._4_4_,0x41600000);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&pred,(float *)&metric);
  metric.super_Metric._vptr_Metric = (_func_int **)&PTR__Metric_001711b0;
  metric.error_ = 0.0;
  metric.total_example_ = 0;
  uVar1 = std::thread::hardware_concurrency();
  auVar4._8_56_ = extraout_var;
  auVar4._0_8_ = extraout_XMM1_Qa;
  auVar3 = auVar4._0_16_;
  this_00 = (ThreadPool *)operator_new(0x120);
  ThreadPool::ThreadPool(this_00,(ulong)uVar1);
  Metric::Initialize(&metric.super_Metric,this_00);
  MAEMetric::Accumulate(&metric,&Y,&pred);
  auVar3 = vcvtusi2ss_avx512f(auVar3,metric.total_example_);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)&gtest_ar,"metric_val","1.0",metric.error_ / auVar3._0_4_,1.0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric_test.cc"
               ,199,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  metric.error_ = 0.0;
  metric.total_example_ = 0;
  Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start[0] =
       23.0;
  Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start[1] =
       24.0;
  Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start[2] =
       25.0;
  Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start[3] =
       26.0;
  *pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       12.0;
  pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start[1]
       = 12.0;
  pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start[2]
       = 12.0;
  pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start[3]
       = 12.0;
  MAEMetric::Accumulate(&metric,&Y,&pred);
  auVar3 = vcvtusi2ss_avx512f(in_XMM2,metric.total_example_);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)&gtest_ar,"metric_val","12.5",metric.error_ / auVar3._0_4_,12.5);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric_test.cc"
               ,0xd3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  MAEMetric::metric_type_abi_cxx11_((string *)&gtest_ar,&metric);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&gtest_ar_2,"metric.metric_type()","\"MAE\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (char (*) [4])"MAE");
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric_test.cc"
               ,0xd4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&pred.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&Y.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

TEST(RecallMetricTest, recall_test) {
  std::vector<real_t> Y;
  Y.push_back(1.0);
  Y.push_back(1.0);
  Y.push_back(-1.0);
  Y.push_back(-1.0);
  std::vector<real_t> pred;
  pred.push_back(100);
  pred.push_back(32);
  pred.push_back(12);
  pred.push_back(-21);
  RecallMetric metric;
  size_t threadNumber = std::thread::hardware_concurrency();
  ThreadPool* pool = new ThreadPool(threadNumber);
  metric.Initialize(pool);
  metric.Accumulate(Y, pred);
  real_t metric_val = metric.GetMetric();
  EXPECT_FLOAT_EQ(metric_val, (2.0 / 2.0));
  metric.Reset();
  Y[0] = 1.0;
  Y[1] = -1.0;
  Y[2] = 1.0;
  Y[3] = -1.0;
  pred[0] = 12;
  pred[1] = 12;
  pred[2] = -12;
  pred[3] = -12;
  metric.Accumulate(Y, pred);
  metric_val = metric.GetMetric();
  EXPECT_FLOAT_EQ(metric_val, (1.0 / 2.0));
  EXPECT_EQ(metric.metric_type(), "Recall");
}